

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::DeclareStruct(CWriter *this,TypeVector *types)

{
  Type type;
  byte bVar1;
  pointer pTVar2;
  TypeVector *in_RDX;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string name;
  string local_50;
  
  (anonymous_namespace)::CWriter::MangleTypes_abi_cxx11_(&local_50,(CWriter *)types,in_RDX);
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->typevector_structs_,&local_50);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"#ifndef ",8);
    WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"#define ",8);
    WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
    WriteData(this," ",1);
    WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"struct ",7);
    WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
    WriteData(this," ",1);
    Write(this);
    pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar2) {
      uVar3 = 0;
      do {
        type = pTVar2[uVar3];
        Write(this,type);
        bVar1 = MangleType(type);
        Writef(this," %c%d;",(ulong)bVar1,uVar3);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        uVar3 = (ulong)((int)uVar3 + 1);
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3))
      ;
    }
    Write(this);
    WriteData(this,";",1);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"#endif  /* ",0xb);
    WriteData(this,local_50._M_dataplus._M_p,local_50._M_string_length);
    WriteData(this," */",3);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CWriter::DeclareStruct(const TypeVector& types) {
  const std::string name = MangleTypes(types);
  if (!typevector_structs_.insert(name).second) {
    return;
  }

  Write(Newline(), "#ifndef ", name, Newline());
  Write("#define ", name, " ", name, Newline());
  Write("struct ", name, " ", OpenBrace());
  for (Index i = 0; i < types.size(); ++i) {
    const Type type = types[i];
    Write(type);
    Writef(" %c%d;", MangleType(type), i);
    Write(Newline());
  }
  Write(CloseBrace(), ";", Newline(), "#endif  /* ", name, " */", Newline());
}